

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

void copy_value(value *to,value *from,int type)

{
  char *pcVar1;
  Filename *pFVar2;
  FontSpec *pFVar3;
  int type_local;
  value *from_local;
  value *to_local;
  
  switch(type) {
  case 1:
    (to->u).boolval = (_Bool)((from->u).boolval & 1);
    break;
  case 2:
    (to->u).intval = (from->u).intval;
    break;
  case 3:
    pcVar1 = dupstr((from->u).stringval);
    (to->u).stringval = pcVar1;
    break;
  case 4:
    pFVar2 = filename_copy((from->u).fileval);
    (to->u).fileval = pFVar2;
    break;
  case 5:
    pFVar3 = fontspec_copy((from->u).fontval);
    (to->u).fontval = pFVar3;
  }
  return;
}

Assistant:

static void copy_value(struct value *to, struct value *from, int type)
{
    switch (type) {
      case TYPE_BOOL:
        to->u.boolval = from->u.boolval;
        break;
      case TYPE_INT:
        to->u.intval = from->u.intval;
        break;
      case TYPE_STR:
        to->u.stringval = dupstr(from->u.stringval);
        break;
      case TYPE_FILENAME:
        to->u.fileval = filename_copy(from->u.fileval);
        break;
      case TYPE_FONT:
        to->u.fontval = fontspec_copy(from->u.fontval);
        break;
    }
}